

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildClientReply(Value *__return_storage_ptr__,cmFileAPI *this,ClientQuery *q)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  Value *this_00;
  Value *pVVar4;
  Value local_98;
  Value local_70;
  string *local_48;
  ClientQueryJson *qj;
  Value *local_30;
  Value *reply_query_json;
  ClientQuery *local_20;
  ClientQuery *q_local;
  cmFileAPI *this_local;
  Value *reply;
  
  reply_query_json._7_1_ = 0;
  local_20 = q;
  q_local = (ClientQuery *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  BuildReply(__return_storage_ptr__,this,&q->DirQuery);
  if ((local_20->HaveQueryJson & 1U) != 0) {
    local_30 = Json::Value::operator[](__return_storage_ptr__,"query.json");
    local_48 = &(local_20->QueryJson).Error;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      BuildReplyError(&local_70,local_48);
      Json::Value::operator=(local_30,&local_70);
      Json::Value::~Value(&local_70);
    }
    else {
      bVar2 = Json::Value::isNull((Value *)(local_48 + 1));
      if (!bVar2) {
        pVVar4 = (Value *)(local_48 + 1);
        this_00 = Json::Value::operator[](local_30,"client");
        Json::Value::operator=(this_00,pVVar4);
      }
      bVar2 = Json::Value::isNull((Value *)&local_48[2]._M_string_length);
      if (!bVar2) {
        psVar1 = local_48 + 2;
        pVVar4 = Json::Value::operator[](local_30,"requests");
        Json::Value::operator=(pVVar4,(Value *)&psVar1->_M_string_length);
      }
      BuildClientReplyResponses(&local_98,this,(ClientRequests *)&local_48[3].field_2);
      pVVar4 = Json::Value::operator[](local_30,"responses");
      Json::Value::operator=(pVVar4,&local_98);
      Json::Value::~Value(&local_98);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReply(ClientQuery const& q)
{
  Json::Value reply = this->BuildReply(q.DirQuery);

  if (!q.HaveQueryJson) {
    return reply;
  }

  Json::Value& reply_query_json = reply["query.json"];
  ClientQueryJson const& qj = q.QueryJson;

  if (!qj.Error.empty()) {
    reply_query_json = this->BuildReplyError(qj.Error);
    return reply;
  }

  if (!qj.ClientValue.isNull()) {
    reply_query_json["client"] = qj.ClientValue;
  }

  if (!qj.RequestsValue.isNull()) {
    reply_query_json["requests"] = qj.RequestsValue;
  }

  reply_query_json["responses"] = this->BuildClientReplyResponses(qj.Requests);

  return reply;
}